

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_address.cc
# Opt level: O2

raptor_error
raptor_blocking_resolve_address(char *name,char *default_port,raptor_resolved_addresses **addresses)

{
  addrinfo *paVar1;
  addrinfo *paVar2;
  UniquePtr<char> __s1;
  int iVar3;
  char *__p;
  long *plVar4;
  void *pvVar5;
  long *in_RCX;
  long lVar6;
  long lVar7;
  size_t size;
  addrinfo **__pai;
  addrinfo **ppaVar8;
  RefCountedPtr<raptor::Status> local_a0;
  UniquePtr<char> port;
  UniquePtr<char> host;
  addrinfo *result;
  char *name_local;
  StringView local_78;
  addrinfo local_68;
  
  result = (addrinfo *)0x0;
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  host._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
  super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_raptor::DefaultDeleteChar,_true,_true>)
                 (__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)0x0;
  port._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
  super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_raptor::DefaultDeleteChar,_true,_true>)
                 (__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)0x0;
  name_local = default_port;
  raptor::StringView::StringView(&local_78,default_port);
  raptor::SplitHostPort(local_78,&host,&port);
  if ((__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)
      host._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
      super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>
      ._M_head_impl == (__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)0x0) {
    raptor::MakeStatusFromFormat<char_const(&)[27],char_const*&>
              ((raptor *)&local_a0,(char (*) [27])"unparseable host:port (%s)",&name_local);
    raptor::RefCountedPtr<raptor::Status>::reset
              ((RefCountedPtr<raptor::Status> *)name,local_a0._value);
  }
  else {
    if ((__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)
        port._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
        super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)0x0) {
      if (addresses == (raptor_resolved_addresses **)0x0) {
        raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
                  ((raptor *)&local_a0,(char (*) [21])"no port in name (%s)",&name_local);
        raptor::RefCountedPtr<raptor::Status>::reset
                  ((RefCountedPtr<raptor::Status> *)name,local_a0._value);
        goto LAB_0010cb38;
      }
      __p = raptor_strdup((char *)addresses);
      std::__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>::reset
                ((__uniq_ptr_impl<char,_raptor::DefaultDeleteChar> *)&port,__p);
    }
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_socktype = 1;
    local_68.ai_protocol = 0;
    local_68.ai_flags = 1;
    local_68.ai_family = 0;
    __pai = (addrinfo **)&result;
    iVar3 = getaddrinfo((char *)host._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>.
                                _M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl,
                        (char *)port._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>.
                                _M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl,&local_68,__pai);
    __s1 = port;
    if (iVar3 != 0) {
      lVar7 = 0;
      do {
        lVar6 = lVar7;
        if (lVar6 + 0x10 == 0x30) goto LAB_0010ca36;
        iVar3 = strcmp((char *)__s1._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t
                               .super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl,
                       *(char **)((long)&PTR_anon_var_dwarf_349bb_001198b0 + lVar6));
        lVar7 = lVar6 + 0x10;
      } while (iVar3 != 0);
      iVar3 = getaddrinfo((char *)host._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>.
                                  _M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                                  super__Head_base<0UL,_char_*,_false>._M_head_impl,
                          *(char **)((long)&PTR_anon_var_dwarf_349d1_001198b8 + lVar6),&local_68,
                          (addrinfo **)&result);
      if (iVar3 != 0) {
LAB_0010ca36:
        raptor::MakeStatusFromPosixError((raptor *)&local_a0,"getaddrinfo");
        raptor::RefCountedPtr<raptor::Status>::reset
                  ((RefCountedPtr<raptor::Status> *)name,local_a0._value);
        goto LAB_0010cb38;
      }
    }
    plVar4 = (long *)raptor::Malloc(0x10);
    *in_RCX = (long)plVar4;
    *plVar4 = 0;
    lVar7 = 1;
    size = 0;
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      *plVar4 = lVar7;
      size = size + 0x84;
      lVar7 = lVar7 + 1;
      __pai = &paVar1->ai_next;
    }
    pvVar5 = raptor::Malloc(size);
    *(void **)(*in_RCX + 8) = pvVar5;
    lVar7 = 0;
    ppaVar8 = &result;
    while (paVar2 = *ppaVar8, paVar2 != (addrinfo *)0x0) {
      memcpy((void *)(*(long *)(*in_RCX + 8) + lVar7),paVar2->ai_addr,(ulong)paVar2->ai_addrlen);
      *(socklen_t *)(*(long *)(*in_RCX + 8) + 0x80 + lVar7) = paVar2->ai_addrlen;
      lVar7 = lVar7 + 0x84;
      ppaVar8 = &paVar2->ai_next;
    }
    local_a0._value = (Status *)0x0;
    raptor::RefCountedPtr<raptor::Status>::reset
              ((RefCountedPtr<raptor::Status> *)name,(Status *)0x0);
  }
LAB_0010cb38:
  local_a0._value = (Status *)0x0;
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&local_a0);
  if (result != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)result);
  }
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr(&port);
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr(&host);
  return (raptor_error)(Status *)name;
}

Assistant:

raptor_error raptor_blocking_resolve_address(
                                const char* name,
                                const char* default_port,
                                raptor_resolved_addresses** addresses) {

    struct addrinfo hints;
    struct addrinfo *result = nullptr, *resp;
    int s;
    size_t i;
    raptor_error err = RAPTOR_ERROR_NONE;

    /* parse name, splitting it into host and port parts */
    raptor::UniquePtr<char> host;
    raptor::UniquePtr<char> port;
    raptor::SplitHostPort(name, &host, &port);

    if (host == nullptr) {
        err = RAPTOR_ERROR_FROM_FORMAT("unparseable host:port (%s)", name);
        goto done;
    }

    if (port == nullptr) {
        if (default_port == nullptr) {
            err = RAPTOR_ERROR_FROM_FORMAT("no port in name (%s)", name);
            goto done;
        }
        port.reset(raptor_strdup(default_port));
    }

    /* Call getaddrinfo */
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;     /* ipv4 or ipv6 */
    hints.ai_socktype = SOCK_STREAM; /* stream socket */
    hints.ai_flags = AI_PASSIVE;     /* for wildcard IP address */

    s = getaddrinfo(host.get(), port.get(), &hints, &result);
    if (s != 0) {
        /* Retry if well-known service name is recognized */
        const char* svc[][2] = {{"http", "80"}, {"https", "443"}};
        for (i = 0; i < RAPTOR_ARRAY_SIZE(svc); i++) {
            if (strcmp(port.get(), svc[i][0]) == 0) {
                s = getaddrinfo(host.get(), svc[i][1], &hints, &result);
                break;
            }
        }
    }

    if (s != 0) {
        err = RAPTOR_POSIX_ERROR("getaddrinfo");
        goto done;
    }

    /* Success path: set addrs non-NULL, fill it in */
    *addresses = static_cast<raptor_resolved_addresses*>(
        raptor::Malloc(sizeof(raptor_resolved_addresses)));
    (*addresses)->naddrs = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        (*addresses)->naddrs++;
    }
    (*addresses)->addrs = static_cast<raptor_resolved_address*>(
        raptor::Malloc(sizeof(raptor_resolved_address) * (*addresses)->naddrs));

    i = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        memcpy(&(*addresses)->addrs[i].addr, resp->ai_addr, resp->ai_addrlen);
        (*addresses)->addrs[i].len = resp->ai_addrlen;
        i++;
    }
    err = RAPTOR_ERROR_NONE;
done:
    if (result) {
        freeaddrinfo(result);
    }
    return err;
}